

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcFlowInstrumentType::IfcFlowInstrumentType(IfcFlowInstrumentType *this)

{
  *(undefined ***)&this->field_0x1d0 = &PTR__Object_0073a1d0;
  *(undefined8 *)&this->field_0x1d8 = 0;
  *(char **)&this->field_0x1e0 = "IfcFlowInstrumentType";
  IfcDistributionControlElementType::IfcDistributionControlElementType
            (&this->super_IfcDistributionControlElementType,&PTR_construction_vtable_24__007604b0);
  *(undefined8 *)&(this->super_IfcDistributionControlElementType).field_0x1a8 = 0;
  *(undefined8 *)
   &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject = 0x760358;
  *(undefined8 *)&this->field_0x1d0 = 0x760498;
  *(undefined8 *)
   &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x88 = 0x760380;
  (this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
  super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x7603a8;
  *(undefined8 *)
   &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0xf0 = 0x7603d0;
  *(undefined8 *)
   &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.field_0x148 = 0x7603f8;
  *(undefined8 *)
   &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
    super_IfcElementType.field_0x180 = 0x760420;
  *(undefined8 *)
   &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
    super_IfcElementType.field_0x190 = 0x760448;
  *(undefined8 *)
   &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.field_0x1a0 =
       0x760470;
  *(undefined1 **)&(this->super_IfcDistributionControlElementType).field_0x1b0 = &this->field_0x1c0;
  *(undefined8 *)&this->field_0x1b8 = 0;
  this->field_0x1c0 = 0;
  return;
}

Assistant:

IfcFlowInstrumentType() : Object("IfcFlowInstrumentType") {}